

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

int float128_le_quiet_mipsel(float128 a,float128 b,float_status *status)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  uVar2 = b.high;
  uVar3 = b.low;
  uVar5 = a.high;
  uVar6 = a.low;
  uVar1 = 0xffffffffffff;
  if ((((~uVar5 & 0x7fff000000000000) != 0) ||
      (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
       uVar6 == 0)) &&
     (((~uVar2 & 0x7fff000000000000) != 0 ||
      (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
       uVar3 == 0)))) {
    if ((long)(uVar2 ^ uVar5) < 0) {
      if ((long)uVar5 < 0) {
        bVar7 = true;
      }
      else {
        bVar7 = (((uVar2 | uVar5) & 0x7fffffffffffffff) == 0 && uVar6 == 0) && uVar3 == 0;
      }
    }
    else {
      if ((long)uVar5 < 0) {
        bVar7 = uVar2 < uVar5;
        bVar8 = uVar3 < uVar6;
      }
      else {
        bVar7 = uVar5 < uVar2;
        bVar8 = uVar6 < uVar3;
      }
      bVar7 = (bool)(((bVar8 || uVar6 == uVar3) && uVar5 == uVar2) | bVar7);
    }
    goto LAB_007d100c;
  }
  if (status->snan_bit_is_one == '\0') {
    if ((uVar5 & 0x7fff800000000000) == 0x7fff000000000000) {
      uVar4 = 0x7fffffffffff;
      goto LAB_007d0f99;
    }
LAB_007d0fa1:
    if (status->snan_bit_is_one == '\0') {
      if ((uVar2 & 0x7fff800000000000) == 0x7fff000000000000) {
        uVar1 = 0x7fffffffffff;
        goto LAB_007d0fe3;
      }
    }
    else if (0xfffeffffffffffff < uVar2 * 2) {
LAB_007d0fe3:
      if (uVar3 != 0 || (uVar1 & uVar2) != 0) goto LAB_007d0feb;
    }
  }
  else {
    uVar4 = 0xffffffffffff;
    if (uVar5 * 2 < 0xffff000000000000) goto LAB_007d0fa1;
LAB_007d0f99:
    if ((uVar4 & uVar5) == 0 && uVar6 == 0) goto LAB_007d0fa1;
LAB_007d0feb:
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  bVar7 = false;
LAB_007d100c:
  return (int)bVar7;
}

Assistant:

int float128_le_quiet(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign;

    if (    (    ( extractFloat128Exp( a ) == 0x7FFF )
              && ( extractFloat128Frac0( a ) | extractFloat128Frac1( a ) ) )
         || (    ( extractFloat128Exp( b ) == 0x7FFF )
              && ( extractFloat128Frac0( b ) | extractFloat128Frac1( b ) ) )
       ) {
        if (float128_is_signaling_nan(a, status)
         || float128_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    aSign = extractFloat128Sign( a );
    bSign = extractFloat128Sign( b );
    if ( aSign != bSign ) {
        return
               aSign
            || (    ( ( (uint64_t) ( ( a.high | b.high )<<1 ) ) | a.low | b.low )
                 == 0 );
    }
    return
          aSign ? le128( b.high, b.low, a.high, a.low )
        : le128( a.high, a.low, b.high, b.low );

}